

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemMap.cpp
# Opt level: O1

void __thiscall MemMap::~MemMap(MemMap *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->mmap_ptr != (uint8_t *)0x0) {
    munmap(this->mmap_ptr,this->fsize);
  }
  if (1 < this->fd + 1U) {
    close(this->fd);
  }
  pcVar1 = (this->fname)._M_dataplus._M_p;
  paVar2 = &(this->fname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MemMap::~MemMap() {
    if (mmap_ptr != nullptr) {
        munmap(mmap_ptr, fsize);
    }

    if (fd != -1 && fd != 0) {
        close(fd);
    }
}